

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteExprList(WatWriter *this,ExprList *exprs)

{
  undefined1 local_90 [8];
  ExprVisitor visitor;
  ExprVisitorDelegate delegate;
  ExprList *exprs_local;
  WatWriter *this_local;
  
  ExprVisitorDelegate::ExprVisitorDelegate
            ((ExprVisitorDelegate *)
             &visitor.catch_index_stack_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this);
  ExprVisitor::ExprVisitor
            ((ExprVisitor *)local_90,
             (Delegate *)
             &visitor.catch_index_stack_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ExprVisitor::VisitExprList((ExprVisitor *)local_90,exprs);
  ExprVisitor::~ExprVisitor((ExprVisitor *)local_90);
  ExprVisitorDelegate::~ExprVisitorDelegate
            ((ExprVisitorDelegate *)
             &visitor.catch_index_stack_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void WatWriter::WriteExprList(const ExprList& exprs) {
  WABT_TRACE(WriteExprList);
  ExprVisitorDelegate delegate(this);
  ExprVisitor visitor(&delegate);
  visitor.VisitExprList(const_cast<ExprList&>(exprs));
}